

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O0

int16_t m_bonus_calc(int max,int level,aspect bonus_aspect)

{
  aspect bonus_aspect_local;
  int level_local;
  int max_local;
  
  switch(bonus_aspect) {
  case MINIMISE:
    level_local._2_2_ = 0;
    break;
  case AVERAGE:
    level_local._2_2_ = (int16_t)((max * level) / 0x80);
    break;
  case MAXIMISE:
  case EXTREMIFY:
    level_local._2_2_ = (int16_t)max;
    break;
  case RANDOMISE:
    level_local._2_2_ = m_bonus(max,level);
    break;
  default:
    __assert_fail("0 && \"Should never reach here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0x1ee,"int16_t m_bonus_calc(int, int, aspect)");
  }
  return level_local._2_2_;
}

Assistant:

int16_t m_bonus_calc(int max, int level, aspect bonus_aspect)
{
	switch (bonus_aspect) {
		case EXTREMIFY:
		case MAXIMISE:  return max;
		case RANDOMISE: return m_bonus(max, level);
		case MINIMISE:  return 0;
		case AVERAGE:   return max * level / MAX_RAND_DEPTH;
	}

	assert(0 && "Should never reach here");
	return 0;
}